

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndPopup(void)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  window_00 = GImGui->CurrentWindow;
  if ((window_00->Flags & 0x4000000U) == 0) {
    __assert_fail("window->Flags & ImGuiWindowFlags_Popup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                  ,0x1f16,"void ImGui::EndPopup()");
  }
  if (0 < (GImGui->BeginPopupStack).Size) {
    if (GImGui->NavWindow == window_00) {
      NavMoveRequestTryWrapping(window_00,2);
    }
    if ((pIVar1->WithinEndChild & 1U) == 0) {
      if ((window_00->Flags & 0x1000000U) != 0) {
        pIVar1->WithinEndChild = true;
      }
      End();
      pIVar1->WithinEndChild = false;
      return;
    }
    __assert_fail("g.WithinEndChild == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                  ,0x1f1e,"void ImGui::EndPopup()");
  }
  __assert_fail("g.BeginPopupStack.Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                ,0x1f17,"void ImGui::EndPopup()");
}

Assistant:

void ImGui::EndPopup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window->Flags & ImGuiWindowFlags_Popup);  // Mismatched BeginPopup()/EndPopup() calls
    IM_ASSERT(g.BeginPopupStack.Size > 0);

    // Make all menus and popups wrap around for now, may need to expose that policy.
    if (g.NavWindow == window)
        NavMoveRequestTryWrapping(window, ImGuiNavMoveFlags_LoopY);

    // Child-popups don't need to be laid out
    IM_ASSERT(g.WithinEndChild == false);
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        g.WithinEndChild = true;
    End();
    g.WithinEndChild = false;
}